

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O3

void __thiscall SW2048Game::restart(SW2048Game *this)

{
  int **ppiVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  this->score = 0;
  this->maxCell = 0;
  iVar5 = this->order;
  if (0 < iVar5) {
    ppiVar1 = this->board;
    lVar4 = 0;
    do {
      if (iVar5 < 1) {
        lVar6 = (long)iVar5;
      }
      else {
        piVar2 = ppiVar1[lVar4];
        lVar7 = 0;
        do {
          piVar2[lVar7] = 0;
          lVar7 = lVar7 + 1;
          iVar5 = this->order;
          lVar6 = (long)iVar5;
        } while (lVar7 < lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar6);
  }
  iVar3 = randomGenerate(this,2);
  iVar5 = this->maxCell;
  if (this->maxCell < iVar3) {
    iVar5 = iVar3;
  }
  this->maxCell = iVar5;
  copyToLast(this);
  this->playing = true;
  return;
}

Assistant:

void SW2048Game::restart() {
	int rNum;
	score = 0;
	maxCell = 0;
	initBoard();
	rNum = randomGenerate(2);
	maxCell = rNum > maxCell ? rNum : maxCell;
	copyToLast();
	playing = true;
}